

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglfunctions.cpp
# Opt level: O0

bool __thiscall QOpenGLFunctions::hasOpenGLFeature(QOpenGLFunctions *this,OpenGLFeature feature)

{
  int iVar1;
  uint in_ESI;
  long *in_RDI;
  QOpenGLFunctionsPrivateEx *d;
  undefined8 local_30;
  undefined1 local_1;
  
  if (*in_RDI == 0) {
    local_30 = 0;
  }
  else {
    local_30 = *in_RDI + -0x10;
  }
  if (local_30 == 0) {
    local_1 = false;
  }
  else {
    if (*(int *)(local_30 + 0xb6c) == -1) {
      iVar1 = qt_gl_resolve_features();
      *(int *)(local_30 + 0xb6c) = iVar1;
    }
    local_1 = (*(uint *)(local_30 + 0xb6c) & in_ESI) != 0;
  }
  return local_1;
}

Assistant:

bool QOpenGLFunctions::hasOpenGLFeature(QOpenGLFunctions::OpenGLFeature feature) const
{
    QOpenGLFunctionsPrivateEx *d = static_cast<QOpenGLFunctionsPrivateEx *>(d_ptr);
    if (!d)
        return false;
    if (d->m_features == -1)
        d->m_features = qt_gl_resolve_features();
    return (d->m_features & int(feature)) != 0;
}